

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLTypeConversions.hpp
# Opt level: O2

GLenum Diligent::BlendFactor2GLBlend(BLEND_FACTOR bf)

{
  char (*in_RCX) [43];
  string msg;
  string local_30;
  
  if ('\x11' < (char)bf) {
    FormatString<char[26],char[43]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"bf < int{_countof(BlendFactor2GLBlendMap)}",in_RCX);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"BlendFactor2GLBlend",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
               ,0x183);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return BlendFactor2GLBlend::BlendFactor2GLBlendMap[(char)bf];
}

Assistant:

inline GLenum BlendFactor2GLBlend(BLEND_FACTOR bf)
{
    // clang-format off
    static constexpr GLenum BlendFactor2GLBlendMap[] =
    {
        0,                           // BLEND_FACTOR_UNDEFINED == 0
        GL_ZERO,                     // BLEND_FACTOR_ZERO
        GL_ONE,                      // BLEND_FACTOR_ONE
        GL_SRC_COLOR,                // BLEND_FACTOR_SRC_COLOR
        GL_ONE_MINUS_SRC_COLOR,      // BLEND_FACTOR_INV_SRC_COLOR
        GL_SRC_ALPHA,                // BLEND_FACTOR_SRC_ALPHA
        GL_ONE_MINUS_SRC_ALPHA,      // BLEND_FACTOR_INV_SRC_ALPHA
        GL_DST_ALPHA,                // BLEND_FACTOR_DEST_ALPHA
        GL_ONE_MINUS_DST_ALPHA,      // BLEND_FACTOR_INV_DEST_ALPHA
        GL_DST_COLOR,                // BLEND_FACTOR_DEST_COLOR
        GL_ONE_MINUS_DST_COLOR,      // BLEND_FACTOR_INV_DEST_COLOR
        GL_SRC_ALPHA_SATURATE,       // BLEND_FACTOR_SRC_ALPHA_SAT
        GL_CONSTANT_COLOR,           // BLEND_FACTOR_BLEND_FACTOR
        GL_ONE_MINUS_CONSTANT_COLOR, // BLEND_FACTOR_INV_BLEND_FACTOR
        GL_SRC1_COLOR,               // BLEND_FACTOR_SRC1_COLOR
        GL_ONE_MINUS_SRC1_COLOR,     // BLEND_FACTOR_INV_SRC1_COLOR
        GL_SRC1_ALPHA,               // BLEND_FACTOR_SRC1_ALPHA
        GL_ONE_MINUS_SRC1_ALPHA      // BLEND_FACTOR_INV_SRC1_ALPHA
    };
    // clang-format on

    VERIFY_EXPR(bf < int{_countof(BlendFactor2GLBlendMap)});
    return BlendFactor2GLBlendMap[bf];
}